

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

void __thiscall
llvm::SmallVector<llvm::DWARFDebugLoc::Entry,_2U>::~SmallVector
          (SmallVector<llvm::DWARFDebugLoc::Entry,_2U> *this)

{
  ulong uVar1;
  undefined1 *puVar2;
  long lVar3;
  
  puVar2 = (undefined1 *)
           (this->super_SmallVectorImpl<llvm::DWARFDebugLoc::Entry>).
           super_SmallVectorTemplateBase<llvm::DWARFDebugLoc::Entry,_false>.
           super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void>.super_SmallVectorBase.
           BeginX;
  uVar1 = (ulong)(this->super_SmallVectorImpl<llvm::DWARFDebugLoc::Entry>).
                 super_SmallVectorTemplateBase<llvm::DWARFDebugLoc::Entry,_false>.
                 super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void>.
                 super_SmallVectorBase.Size;
  if (uVar1 != 0) {
    puVar2 = puVar2 + uVar1 * 0x28 + -8;
    lVar3 = uVar1 * -0x28;
    do {
      if (puVar2 != *(undefined1 **)(puVar2 + -0x10)) {
        free(*(undefined1 **)(puVar2 + -0x10));
      }
      puVar2 = puVar2 + -0x28;
      lVar3 = lVar3 + 0x28;
    } while (lVar3 != 0);
    puVar2 = (undefined1 *)
             (this->super_SmallVectorImpl<llvm::DWARFDebugLoc::Entry>).
             super_SmallVectorTemplateBase<llvm::DWARFDebugLoc::Entry,_false>.
             super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void>.super_SmallVectorBase
             .BeginX;
  }
  if ((SmallVectorStorage<llvm::DWARFDebugLoc::Entry,_2U> *)puVar2 !=
      &this->super_SmallVectorStorage<llvm::DWARFDebugLoc::Entry,_2U>) {
    free(puVar2);
    return;
  }
  return;
}

Assistant:

~SmallVector() {
    // Destroy the constructed elements in the vector.
    this->destroy_range(this->begin(), this->end());
  }